

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genx.c
# Opt level: O3

genxStatus genxStartElement(genxElement e)

{
  writerSequence wVar1;
  genxWriter w;
  void **ppvVar2;
  genxStatus gVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  
  w = e->writer;
  wVar1 = w->sequence;
  if (wVar1 - SEQUENCE_START_TAG < 2) {
    gVar3 = writeStartTag(w);
    w->status = gVar3;
    if (gVar3 != GENX_SUCCESS) {
      return gVar3;
    }
  }
  else if ((wVar1 == SEQUENCE_POST_DOC) || (wVar1 == SEQUENCE_NO_DOC)) {
    w->status = GENX_SEQUENCE_ERROR;
    return GENX_SEQUENCE_ERROR;
  }
  w->sequence = SEQUENCE_START_TAG;
  lVar5 = (long)(w->attributes).count;
  if (0 < lVar5) {
    ppvVar2 = (w->attributes).pointers;
    lVar6 = 0;
    do {
      *(undefined4 *)((long)ppvVar2[lVar6] + 0x28) = 0;
      lVar6 = lVar6 + 1;
    } while (lVar5 != lVar6);
  }
  iVar4 = checkExpand(&w->stack);
  if (iVar4 != 0) {
    iVar4 = (w->stack).count;
    (w->stack).count = iVar4 + 1;
    (w->stack).pointers[iVar4] = e;
    w->status = GENX_SUCCESS;
    iVar4 = checkExpand(&w->stack);
    if (iVar4 != 0) {
      iVar4 = (w->stack).count;
      (w->stack).count = iVar4 + 1;
      (w->stack).pointers[iVar4] = (void *)0x0;
      w->status = GENX_SUCCESS;
      w->nowStarting = e;
      return GENX_SUCCESS;
    }
  }
  w->status = GENX_ALLOC_FAILED;
  return GENX_ALLOC_FAILED;
}

Assistant:

genxStatus genxStartElement(genxElement e)
{
  genxWriter w = e->writer;
  int i;

  switch (w->sequence)
  {
  case SEQUENCE_NO_DOC:
  case SEQUENCE_POST_DOC:
    return w->status = GENX_SEQUENCE_ERROR;
  case SEQUENCE_START_TAG:
  case SEQUENCE_ATTRIBUTES:
    if ((w->status = writeStartTag(w)) != GENX_SUCCESS)
      return w->status;
    break;
  case SEQUENCE_PRE_DOC:
  case SEQUENCE_CONTENT:
    break;
  }

  w->sequence = SEQUENCE_START_TAG;

  /* clear provided attributes */
  for (i = 0; i < w->attributes.count; i++)
    ((genxAttribute) w->attributes.pointers[i])->provided = 0;

  /*
   * push the stack.  We push a NULL after a pointer to this element
   *  because the stack will also contain pointers to the namespace
   *  attributes that got declared here, so we can keep track of what's
   *  in effect.  I.e. a single stack entry consists logically of a pointer
   *  to an element object, a NULL, then zero or more pairs of pointers to
   *  namespace objects/declarations
   */
  if ((w->status = listAppend(&w->stack, e)) != GENX_SUCCESS)
    return w->status;
  if ((w->status = listAppend(&w->stack, NULL)) != GENX_SUCCESS)
    return w->status;

  w->nowStarting = e;

  return GENX_SUCCESS;
}